

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O3

S2Cap * __thiscall S2Cell::GetCapBound(S2Cap *__return_storage_ptr__,S2Cell *this)

{
  bool bVar1;
  int k;
  int k_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  S2Point local_38;
  
  dVar4 = ((this->uv_).bounds_[0].bounds_.c_[0] + (this->uv_).bounds_[0].bounds_.c_[1]) * 0.5;
  dVar2 = ((this->uv_).bounds_[1].bounds_.c_[0] + (this->uv_).bounds_[1].bounds_.c_[1]) * 0.5;
  dVar3 = dVar2;
  dVar5 = dVar2;
  switch(this->face_) {
  case '\0':
    dVar5 = 1.0;
    break;
  case '\x01':
    dVar5 = -dVar4;
    dVar4 = 1.0;
    break;
  case '\x02':
    dVar5 = -dVar4;
    dVar4 = -dVar2;
    dVar3 = 1.0;
    break;
  case '\x03':
    dVar5 = -1.0;
    dVar3 = -dVar4;
    dVar4 = -dVar2;
    break;
  case '\x04':
    dVar3 = -dVar4;
    dVar4 = -1.0;
    break;
  default:
    dVar3 = -1.0;
  }
  dVar2 = SQRT(dVar3 * dVar3 + dVar4 * dVar4 + dVar5 * dVar5);
  dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                  (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,0.0);
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
  (__return_storage_ptr__->center_).c_[0] = dVar5 * dVar2;
  (__return_storage_ptr__->center_).c_[1] = dVar4 * dVar2;
  (__return_storage_ptr__->center_).c_[2] = dVar2 * dVar3;
  bVar1 = S2::IsUnitLength(&__return_storage_ptr__->center_);
  if ((bVar1) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
    k_00 = 0;
    do {
      GetVertex(&local_38,this,k_00);
      S2Cap::AddPoint(__return_storage_ptr__,&local_38);
      k_00 = k_00 + 1;
    } while (k_00 != 4);
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
             ,0xf5,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_38.c_[1],"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2Cap S2Cell::GetCapBound() const {
  // Use the cell center in (u,v)-space as the cap axis.  This vector is
  // very close to GetCenter() and faster to compute.  Neither one of these
  // vectors yields the bounding cap with minimal surface area, but they
  // are both pretty close.
  //
  // It's possible to show that the two vertices that are furthest from
  // the (u,v)-origin never determine the maximum cap size (this is a
  // possible future optimization).

  S2Point center = S2::FaceUVtoXYZ(face_, uv_.GetCenter()).Normalize();
  S2Cap cap = S2Cap::FromPoint(center);
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(GetVertex(k));
  }
  return cap;
}